

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadersConfig.h
# Opt level: O3

HeadersConfig *
jaegertracing::propagation::HeadersConfig::parse
          (HeadersConfig *__return_storage_ptr__,Node *configYAML)

{
  bool bVar1;
  char (*in_R8) [1];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> traceBaggageHeaderPrefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> traceContextHeaderName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> jaegerBaggageHeader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> jaegerDebugHeader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((configYAML->m_isValid != true) ||
     (((configYAML->m_pNode != (node *)0x0 &&
       (*(char *)**(undefined8 **)configYAML->m_pNode != '\x01')) ||
      (bVar1 = YAML::Node::IsMap(configYAML), !bVar1)))) {
    HeadersConfig(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  utils::yaml::findOrDefault<std::__cxx11::string,char[18],char[1]>
            (&local_38,(yaml *)configYAML,(Node *)"jaegerDebugHeader",(char (*) [18])0x22a949,in_R8)
  ;
  utils::yaml::findOrDefault<std::__cxx11::string,char[20],char[1]>
            (&local_58,(yaml *)configYAML,(Node *)"jaegerBaggageHeader",(char (*) [20])0x22a949,
             in_R8);
  utils::yaml::findOrDefault<std::__cxx11::string,char[23],char[1]>
            (&local_78,(yaml *)configYAML,(Node *)"TraceContextHeaderName",(char (*) [23])0x22a949,
             in_R8);
  utils::yaml::findOrDefault<std::__cxx11::string,char[25],char[1]>
            (&local_98,(yaml *)configYAML,(Node *)"traceBaggageHeaderPrefix",(char (*) [25])0x22a949
             ,in_R8);
  HeadersConfig(__return_storage_ptr__,&local_38,&local_58,&local_78,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p == &local_38.field_2) {
    return __return_storage_ptr__;
  }
  operator_delete(local_38._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

static HeadersConfig parse(const YAML::Node& configYAML)
    {
        if (!configYAML.IsDefined() || !configYAML.IsMap()) {
            return HeadersConfig();
        }

        const auto jaegerDebugHeader = utils::yaml::findOrDefault<std::string>(
            configYAML, "jaegerDebugHeader", "");
        const auto jaegerBaggageHeader =
            utils::yaml::findOrDefault<std::string>(
                configYAML, "jaegerBaggageHeader", "");
        const auto traceContextHeaderName =
            utils::yaml::findOrDefault<std::string>(
                configYAML, "TraceContextHeaderName", "");
        const auto traceBaggageHeaderPrefix =
            utils::yaml::findOrDefault<std::string>(
                configYAML, "traceBaggageHeaderPrefix", "");

        return HeadersConfig(jaegerDebugHeader,
                             jaegerBaggageHeader,
                             traceContextHeaderName,
                             traceBaggageHeaderPrefix);
    }